

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O2

void test_persistence_with_coeff_field(int coeff_field)

{
  ostream *poVar1;
  shared_count sStack_950;
  char *local_948;
  char *local_940;
  string str_persistence;
  string local_910;
  string value9;
  string value8;
  string value7;
  string value6;
  string value5;
  string value4;
  string value3;
  string value2;
  string value1;
  string value0;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value0,"  0 0.02 1.12",(allocator<char> *)&value1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value1,"  0 0.03 1.13",(allocator<char> *)&value2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value2,"  0 0.04 1.14",(allocator<char> *)&value3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value3,"  0 0.05 1.15",(allocator<char> *)&value4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value4,"  0 0.06 1.16",(allocator<char> *)&value5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value5,"  0 0.07 1.17",(allocator<char> *)&value6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value6,"  0 0.08 1.18",(allocator<char> *)&value7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value7,"  0 0.09 1.19",(allocator<char> *)&value8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value8,"  0 0 inf",(allocator<char> *)&value9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value9,"  0 0.01 inf",(allocator<char> *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value0,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value1,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value2,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value3,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value4,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value5,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value6,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value7,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value8,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::to_string(&str_persistence,coeff_field);
  std::__cxx11::string::insert((ulong)&value9,(string *)0x0);
  std::__cxx11::string::~string((string *)&str_persistence);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,coeff_field);
  poVar1 = std::operator<<(poVar1," MIN_PERS=0");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_persistence_abi_cxx11_(&str_persistence,coeff_field,0);
  poVar1 = std::operator<<((ostream *)&std::clog,(string *)&str_persistence);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x55);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value0);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value0) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_58 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x56);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value1);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value1) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_88 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x57);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value2);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value2) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_b8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x58);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value3);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value3) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_e8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x59);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value4);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value4) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_118 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x5a);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value5);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value5) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_148 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x5b);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value6);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value6) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_178 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x5c);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value7);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value7) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1a8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x5d);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value8);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value8) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1d8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x5e);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value9);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value9) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_208 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  poVar1 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar1 = std::operator<<(poVar1,(string *)&str_persistence);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,coeff_field);
  poVar1 = std::operator<<(poVar1," MIN_PERS=1");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_persistence_abi_cxx11_(&local_910,coeff_field,1);
  std::__cxx11::string::operator=((string *)&str_persistence,(string *)&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x66);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value0);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value0) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_238 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x67);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value1);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value1) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_268 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x68);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value2);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value2) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_298 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x69);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value3);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value3) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2c8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x6a);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value4);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value4) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_2f8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x6b);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value5);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value5) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_328 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x6c);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value6);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value6) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_358 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x6d);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value7);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value7) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_388 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x6e);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value8);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value8) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3b8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x6f);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value9);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value9) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3e8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  poVar1 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar1 = std::operator<<(poVar1,(string *)&str_persistence);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,coeff_field);
  poVar1 = std::operator<<(poVar1," MIN_PERS=2");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_persistence_abi_cxx11_(&local_910,coeff_field,2);
  std::__cxx11::string::operator=((string *)&str_persistence,(string *)&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x77);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value0);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value0) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_418 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x78);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value1);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value1) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_448 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x79);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value2);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value2) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_478 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x7a);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value3);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value3) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4a8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x7b);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value4);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value4) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4d8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x7c);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value5);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value5) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_508 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x7d);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value6);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value6) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_538 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x7e);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value7);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value7) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_568 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x7f);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value8);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value8) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_598 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5b0,0x80);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value9);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value9) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5c8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  poVar1 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar1 = std::operator<<(poVar1,(string *)&str_persistence);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,coeff_field);
  poVar1 = std::operator<<(poVar1," MIN_PERS=Inf");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_persistence_abi_cxx11_(&local_910,coeff_field,0x7fffffff);
  std::__cxx11::string::operator=((string *)&str_persistence,(string *)&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5e0,0x88);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value0);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value0) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_5f8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_610,0x89);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value1);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value1) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_628 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_640,0x8a);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value2);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value2) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_658 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_670,0x8b);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value3);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value3) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_688 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6a0,0x8c);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value4);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value4) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6b8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6d0,0x8d);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value5);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value5) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6e8 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_700,0x8e);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value6);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value6) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_718 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_730,0x8f);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value7);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value7) == std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_748 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_760,0x90);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value8);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value8) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_778 = "";
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_788 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_790,0x91);
  std::__cxx11::string::find((string *)&str_persistence,(ulong)&value9);
  sStack_950.pi_ = (sp_counted_base *)0x0;
  local_948 = "str_persistence.find(value9) != std::string::npos";
  local_940 = "";
  local_910._M_string_length._0_1_ = 0;
  local_910._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00127a28;
  local_910.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_910.field_2._8_8_ = &local_948;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_950);
  poVar1 = std::operator<<((ostream *)&std::clog,"str_persistence=");
  poVar1 = std::operator<<(poVar1,(string *)&str_persistence);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&str_persistence);
  std::__cxx11::string::~string((string *)&value9);
  std::__cxx11::string::~string((string *)&value8);
  std::__cxx11::string::~string((string *)&value7);
  std::__cxx11::string::~string((string *)&value6);
  std::__cxx11::string::~string((string *)&value5);
  std::__cxx11::string::~string((string *)&value4);
  std::__cxx11::string::~string((string *)&value3);
  std::__cxx11::string::~string((string *)&value2);
  std::__cxx11::string::~string((string *)&value1);
  std::__cxx11::string::~string((string *)&value0);
  return;
}

Assistant:

void test_persistence_with_coeff_field(int coeff_field) {
  std::string value0("  0 0.02 1.12");
  std::string value1("  0 0.03 1.13");
  std::string value2("  0 0.04 1.14");
  std::string value3("  0 0.05 1.15");
  std::string value4("  0 0.06 1.16");
  std::string value5("  0 0.07 1.17");
  std::string value6("  0 0.08 1.18");
  std::string value7("  0 0.09 1.19");
  std::string value8("  0 0 inf"    );
  std::string value9("  0 0.01 inf" );

  value0.insert(0,std::to_string(coeff_field));
  value1.insert(0,std::to_string(coeff_field));
  value2.insert(0,std::to_string(coeff_field));
  value3.insert(0,std::to_string(coeff_field));
  value4.insert(0,std::to_string(coeff_field));
  value5.insert(0,std::to_string(coeff_field));
  value6.insert(0,std::to_string(coeff_field));
  value7.insert(0,std::to_string(coeff_field));
  value8.insert(0,std::to_string(coeff_field));
  value9.insert(0,std::to_string(coeff_field));

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=0" << std::endl;

  std::string str_persistence = test_persistence(coeff_field, 0);
  std::clog << str_persistence << std::endl;
  
  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=1" << std::endl;

  str_persistence = test_persistence(coeff_field, 1);

  BOOST_CHECK(str_persistence.find(value0) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value1) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value2) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value3) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value4) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value5) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value6) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value7) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=2" << std::endl;

  str_persistence = test_persistence(coeff_field, 2);

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;

  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF PERSISTENT_COHOMOLOGY_SINGLE_FIELD COEFF_FIELD=" << coeff_field << " MIN_PERS=Inf" << std::endl;

  str_persistence = test_persistence(coeff_field, (std::numeric_limits<int>::max)());

  BOOST_CHECK(str_persistence.find(value0) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value1) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value2) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value3) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value4) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value5) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value6) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value7) == std::string::npos); // Check not found
  BOOST_CHECK(str_persistence.find(value8) != std::string::npos); // Check found
  BOOST_CHECK(str_persistence.find(value9) != std::string::npos); // Check found
  std::clog << "str_persistence=" << str_persistence << std::endl;
}